

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O2

int run_test_tcp_open_twice(void)

{
  uv_os_sock_t uVar1;
  uv_os_sock_t __fd;
  int iVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_a;
  uv_tcp_t client;
  
  uVar1 = create_tcp_socket();
  __fd = create_tcp_socket();
  uVar3 = uv_default_loop();
  iVar2 = uv_tcp_init(uVar3,&client);
  eval_a = (int64_t)iVar2;
  eval_b = 0;
  if (eval_a == 0) {
    iVar2 = uv_tcp_open(&client,uVar1);
    eval_a = (int64_t)iVar2;
    eval_b = 0;
    if (eval_a == 0) {
      iVar2 = uv_tcp_open(&client,__fd);
      eval_a = (int64_t)iVar2;
      eval_b = -0x10;
      if (eval_a == -0x10) {
        iVar2 = close(__fd);
        eval_a = (int64_t)iVar2;
        eval_b = 0;
        if (eval_a == 0) {
          uv_close(&client,0);
          uVar3 = uv_default_loop();
          uv_run(uVar3,0);
          loop = (uv_loop_t *)uv_default_loop();
          close_loop(loop);
          eval_a = 0;
          uVar3 = uv_default_loop();
          iVar2 = uv_loop_close(uVar3);
          eval_b = (int64_t)iVar2;
          if (eval_b == 0) {
            uv_library_shutdown();
            return 0;
          }
          pcVar5 = "uv_loop_close(uv_default_loop())";
          pcVar4 = "0";
          uVar3 = 0x133;
        }
        else {
          pcVar5 = "0";
          pcVar4 = "r";
          uVar3 = 0x54;
        }
      }
      else {
        pcVar5 = "UV_EBUSY";
        pcVar4 = "r";
        uVar3 = 0x12d;
      }
    }
    else {
      pcVar5 = "0";
      pcVar4 = "r";
      uVar3 = 0x12a;
    }
  }
  else {
    pcVar5 = "0";
    pcVar4 = "r";
    uVar3 = 0x127;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-open.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(tcp_open_twice) {
  uv_tcp_t client;
  uv_os_sock_t sock1, sock2;
  int r;

  startup();
  sock1 = create_tcp_socket();
  sock2 = create_tcp_socket();

  r = uv_tcp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  r = uv_tcp_open(&client, sock1);
  ASSERT_OK(r);

  r = uv_tcp_open(&client, sock2);
  ASSERT_EQ(r, UV_EBUSY);
  close_socket(sock2);

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}